

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapSunflower(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v;
  uint64_t cs;
  uint64_t ss;
  int err;
  int64_t j;
  int64_t i;
  int in_stack_ffffffffffffffa8;
  uint64_t in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_4;
  
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  if (local_4 == 0) {
    for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
      for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
        if (*(int *)(in_RSI + (local_30 + local_38 * in_R8D) * 4) == 1) {
          in_stack_ffffffffffffffb0 =
               getChunkSeed(in_stack_ffffffffffffffb0,1,in_stack_ffffffffffffffa8);
          iVar1 = mcFirstIsZero(in_stack_ffffffffffffffb0,0x39);
          if (iVar1 != 0) {
            *(undefined4 *)(in_RSI + (local_30 + local_38 * in_R8D) * 4) = 0x81;
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapSunflower(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v = out[i + j * w];

            if (v == plains)
            {
                cs = getChunkSeed(ss, i + x, j + z);
                if (mcFirstIsZero(cs, 57))
                {
                    out[i + j*w] = sunflower_plains;
                }
            }
        }
    }

    return 0;
}